

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

void * pthSocketThread(void *x)

{
  int *piVar1;
  int iVar2;
  uint fd;
  ulong uVar3;
  uint *__arg;
  long lVar4;
  FILE *pFVar5;
  char *__format;
  int optval;
  int c;
  pthread_t thr;
  pthread_attr_t attr;
  sockaddr_storage client;
  
  iVar2 = pthread_attr_init((pthread_attr_t *)&attr);
  pFVar5 = _stderr;
  if (iVar2 == 0) {
    iVar2 = pthread_attr_setstacksize((pthread_attr_t *)&attr,0x40000);
    pFVar5 = _stderr;
    if (iVar2 == 0) {
      iVar2 = pthread_attr_setdetachstate((pthread_attr_t *)&attr,1);
      pFVar5 = _stderr;
      if (iVar2 == 0) {
        listen(fdSock,100);
        c = 0x80;
        spinWhileStarting();
        fd = 0;
LAB_0010fe3a:
        do {
          pFVar5 = _stderr;
          if ((int)fd < 0) {
            if ((gpioCfg.internals >> 10 & 1) != 0) {
              return (void *)0xffffffffffffffff;
            }
            myTimeStamp();
            __format = "%s %s: accept failed (%m)\n";
            goto LAB_00110089;
          }
          fd = accept(fdSock,(sockaddr *)&client,(socklen_t *)&c);
          closeOrphanedNotifications(-1,fd);
          pFVar5 = _stderr;
          if (numSockNetAddr != 0) {
            if (client.ss_family != 2) {
LAB_0010ff37:
              if ((gpioCfg.internals >> 10 & 1) == 0) {
                myTimeStamp();
                fprintf(pFVar5,"%s %s: Connection rejected, closing\n",myTimeStamp::buf,
                        "pthSocketThread");
              }
              close(fd);
              goto LAB_0010fe3a;
            }
            uVar3 = (ulong)(uint)numSockNetAddr;
            if (numSockNetAddr < 1) {
              uVar3 = 0;
            }
            lVar4 = 0;
            do {
              if (uVar3 * 4 == lVar4) goto LAB_0010ff37;
              piVar1 = (int *)((long)sockNetAddr + lVar4);
              lVar4 = lVar4 + 4;
            } while (client.__ss_padding._2_4_ != *piVar1);
          }
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            myTimeStamp();
            fprintf(pFVar5,"%s %s: Connection accepted on socket %d\n",myTimeStamp::buf,
                    "pthSocketThread",(ulong)fd);
          }
          __arg = (uint *)malloc(4);
          *__arg = fd;
          optval = 1;
          iVar2 = setsockopt(fd,1,9,&optval,4);
          pFVar5 = _stderr;
          if (iVar2 < 0) {
            if ((gpioCfg.internals >> 10 & 1) == 0) {
              myTimeStamp();
              fprintf(pFVar5,"%s %s: setsockopt() fail, closing socket %d\n",myTimeStamp::buf,
                      "pthSocketThread",(ulong)fd);
            }
            close(fd);
          }
          pFVar5 = _stderr;
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            myTimeStamp();
            fprintf(pFVar5,"%s %s: SO_KEEPALIVE enabled on socket %d\n\n",myTimeStamp::buf,
                    "pthSocketThread",(ulong)fd);
          }
          iVar2 = pthread_create(&thr,(pthread_attr_t *)&attr,pthSocketThreadHandler,__arg);
          pFVar5 = _stderr;
        } while (-1 < iVar2);
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return (void *)0xffffffffffffffff;
        }
        myTimeStamp();
        __format = "%s %s: socket pthread_create failed (%m)\n";
      }
      else {
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return (void *)0xffffffffffffffff;
        }
        myTimeStamp();
        __format = "%s %s: pthread_attr_setdetachstate failed (%m)\n";
      }
    }
    else {
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return (void *)0xffffffffffffffff;
      }
      myTimeStamp();
      __format = "%s %s: pthread_attr_setstacksize failed (%m)\n";
    }
  }
  else {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return (void *)0xffffffffffffffff;
    }
    myTimeStamp();
    __format = "%s %s: pthread_attr_init failed (%m)\n";
  }
LAB_00110089:
  fprintf(pFVar5,__format,myTimeStamp::buf,"pthSocketThread");
  return (void *)0xffffffffffffffff;
}

Assistant:

static void * pthSocketThread(void *x)
{
   int fdC=0, c, *sock;
   struct sockaddr_storage client;
   pthread_attr_t attr;

   if (pthread_attr_init(&attr))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_init failed (%m)");

   if (pthread_attr_setstacksize(&attr, STACK_SIZE))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_setstacksize failed (%m)");

   if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_setdetachstate failed (%m)");

   /* fdSock opened in gpioInitialise so that we can treat
      failure to bind as fatal. */

   listen(fdSock, 100);

   c = sizeof(client);

   /* don't start until DMA started */

   spinWhileStarting();

   while (fdC >= 0)
   {
      pthread_t thr;

      fdC = accept(fdSock, (struct sockaddr *)&client, (socklen_t*)&c);

      closeOrphanedNotifications(-1, fdC);

      if (addrAllowed((struct sockaddr *)&client))
      {
         DBG(DBG_ALWAYS, "Connection accepted on socket %d", fdC);

         sock = malloc(sizeof(int));

         *sock = fdC;

         /* Enable tcp_keepalive */
         int optval = 1;
         socklen_t optlen = sizeof(optval);

         if (setsockopt(fdC, SOL_SOCKET, SO_KEEPALIVE, &optval, optlen) < 0) {
           DBG(0, "setsockopt() fail, closing socket %d", fdC);
           close(fdC);
         }

         DBG(DBG_ALWAYS, "SO_KEEPALIVE enabled on socket %d\n", fdC);

         if (pthread_create
            (&thr, &attr, pthSocketThreadHandler, (void*) sock) < 0)
            SOFT_ERROR((void*)PI_INIT_FAILED,
               "socket pthread_create failed (%m)");
      }
      else
      {
         DBG(DBG_ALWAYS, "Connection rejected, closing");
         close(fdC);
      }
   }

   if (fdC < 0)
      SOFT_ERROR((void*)PI_INIT_FAILED, "accept failed (%m)");

   return 0;
}